

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLoopExpr(BinaryReaderInterp *this,Type sig_type)

{
  bool bVar1;
  Offset offset;
  Location local_48;
  Enum local_24;
  BinaryReaderInterp *local_20;
  BinaryReaderInterp *this_local;
  Type sig_type_local;
  
  local_20 = this;
  unique0x100000cf = sig_type;
  GetLocation(&local_48,this);
  local_24 = (Enum)SharedValidator::OnLoop(&this->validator_,&local_48,stack0xffffffffffffffec);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    offset = Istream::end(this->istream_);
    PushLabel(this,Block,offset,0xffffffff,0xffffffff);
    Result::Result((Result *)&sig_type_local,Ok);
  }
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnLoopExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnLoop(GetLocation(), sig_type));
  PushLabel(LabelKind::Block, istream_.end());
  return Result::Ok;
}